

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O3

qreal __thiscall
KDReports::SpreadsheetReportLayout::paintTableVerticalHeader
          (SpreadsheetReportLayout *this,qreal x,qreal y,QPainter *painter,int row)

{
  QAbstractItemModel *pQVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  Alignment alignment;
  QMetaType QVar5;
  PrivateShared *pPVar6;
  double dVar7;
  QVariant cellDecoration;
  QVariant decorationAlignment;
  QString cellText;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  byte local_e8;
  anon_union_24_3_e3d07ef4_for_data local_d8;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined2 local_ac;
  QRectF local_a8;
  QArrayDataPointer<char16_t> local_80;
  double local_68;
  undefined8 uStack_60;
  QColor local_58;
  QRectF local_48;
  
  pQVar1 = (this->m_tableLayout).m_model;
  local_a8.h = (this->m_tableLayout).m_rowHeight;
  local_a8.w = (this->m_tableLayout).m_vHeaderWidth;
  local_a8.xp = x;
  local_a8.yp = y;
  QFont::QFont((QFont *)&stack0xffffffffffffff00,
               &(this->m_tableLayout).m_verticalHeaderFontScaler.m_font);
  QPainter::setFont((QFont *)painter);
  QFont::~QFont((QFont *)&stack0xffffffffffffff00);
  QPainter::fillRect((QRectF *)painter,(QBrush *)&local_a8);
  drawBorder(this,&local_a8,painter);
  pPVar6 = (PrivateShared *)&stack0xffffffffffffff00;
  (**(code **)(*(long *)pQVar1 + 0xa0))(pPVar6,pQVar1,row,2,9);
  QVar5.d_ptr._4_4_ = in_stack_fffffffffffffefc;
  QVar5.d_ptr._0_4_ = in_stack_fffffffffffffef8;
  bVar4 = operator==((QMetaType)in_stack_ffffffffffffff00,QVar5);
  if (bVar4) {
    if ((local_e8 & 1) != 0) {
      pPVar6 = (PrivateShared *)
               (in_stack_ffffffffffffff00 + (long)(int)*(uint *)(in_stack_ffffffffffffff00 + 4));
    }
    uVar2 = *(undefined8 *)pPVar6;
    local_d8._0_4_ = (undefined4)uVar2;
    local_d8._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
    local_d8._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
    local_d8._8_6_ = (undefined6)*(undefined8 *)(pPVar6 + 8);
    local_d8._14_2_ = (undefined2)((ulong)*(undefined8 *)(pPVar6 + 8) >> 0x30);
  }
  else {
    local_d8._0_4_ = 0;
    local_d8._4_2_ = 0xffff;
    local_d8._6_2_ = 0;
    local_d8._8_6_ = 0;
    pPVar6 = (PrivateShared *)&stack0xffffffffffffff00;
    QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if ((local_e8 & 1) != 0) {
      pPVar6 = (PrivateShared *)
               (in_stack_ffffffffffffff00 + (long)(int)*(uint *)(in_stack_ffffffffffffff00 + 4));
    }
    QMetaType::convert(QVar5,pPVar6,(QMetaType)0x176160,&local_d8);
  }
  uVar3 = local_d8._0_4_;
  local_b8 = CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
  local_b0 = (undefined4)local_d8._8_6_;
  local_ac = (undefined2)((uint6)local_d8._8_6_ >> 0x20);
  QVariant::~QVariant((QVariant *)&stack0xffffffffffffff00);
  if (uVar3 != 0) {
    QPainter::setPen((QColor *)painter);
  }
  (**(code **)(*(long *)pQVar1 + 0xa0))(&stack0xffffffffffffff00,pQVar1,row,2,0);
  QVariant::toString();
  QVariant::~QVariant((QVariant *)&stack0xffffffffffffff00);
  local_68 = (this->m_tableLayout).m_cellPadding *
             (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
  uStack_60 = 0;
  (**(code **)(*(long *)pQVar1 + 0xa0))(&stack0xffffffffffffff00,pQVar1,row,2,7);
  alignment.i = QVariant::toInt((bool *)&stack0xffffffffffffff00);
  QVariant::~QVariant((QVariant *)&stack0xffffffffffffff00);
  (**(code **)(*(long *)pQVar1 + 0xa0))(&stack0xffffffffffffff00,pQVar1,row,2,1);
  (**(code **)(*(long *)pQVar1 + 0xa0))(&local_d8,pQVar1,row,2,0x2d535fb1);
  local_48.xp = local_a8.xp + local_68;
  local_48.yp = local_a8.yp + local_68;
  local_48.w = (local_a8.w - local_68) - local_68;
  local_48.h = (local_a8.h - local_68) - local_68;
  paintTextAndIcon(this,painter,&local_48,(QString *)&local_80,(QVariant *)&stack0xffffffffffffff00,
                   (QVariant *)&local_d8,alignment);
  if ((int)local_b8 != 0) {
    QColor::QColor(&local_58,black);
    QPainter::setPen((QColor *)painter);
  }
  dVar7 = x + local_a8.w;
  QVariant::~QVariant((QVariant *)&local_d8);
  QVariant::~QVariant((QVariant *)&stack0xffffffffffffff00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  return dVar7;
}

Assistant:

qreal KDReports::SpreadsheetReportLayout::paintTableVerticalHeader(qreal x, qreal y, QPainter &painter, int row)
{
    QAbstractItemModel *model = m_tableLayout.m_model;

    const QRectF cellRect(x, y, m_tableLayout.vHeaderWidth(), m_tableLayout.rowHeight());

    painter.setFont(m_tableLayout.verticalHeaderScaledFont());
    painter.fillRect(cellRect, m_tableSettings.m_headerBackground);
    drawBorder(cellRect, painter);

    const QColor foreground = qvariant_cast<QColor>(model->headerData(row, Qt::Vertical, Qt::ForegroundRole));
    if (foreground.isValid())
        painter.setPen(foreground);

    const QString cellText = model->headerData(row, Qt::Vertical).toString();
    const qreal padding = m_tableLayout.scaledCellPadding();
    const Qt::Alignment alignment(model->headerData(row, Qt::Vertical, Qt::TextAlignmentRole).toInt());
    const QVariant cellDecoration = model->headerData(row, Qt::Vertical, Qt::DecorationRole);
    const QVariant decorationAlignment = model->headerData(row, Qt::Vertical, KDReports::AutoTableElement::DecorationAlignmentRole);

    const QRectF cellContentsRect = cellRect.adjusted(padding, padding, -padding, -padding);
    // painter.drawText( cellContentsRect, alignment, cellText );
    paintTextAndIcon(painter, cellContentsRect, cellText, cellDecoration, decorationAlignment, alignment);

    if (foreground.isValid())
        painter.setPen(Qt::black);

    x += cellRect.width();
    return x;
}